

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O0

void __thiscall
jbcoin::STValidation::STValidation(STValidation *this,SerialIter *sit,bool checkSignature)

{
  bool bVar1;
  SOTemplate *type;
  undefined1 local_260 [40];
  ScopedStream local_238;
  Stream local_a8;
  Blob local_98;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_80;
  PublicKey local_70;
  NodeID local_40;
  byte local_19;
  SerialIter *pSStack_18;
  bool checkSignature_local;
  SerialIter *sit_local;
  STValidation *this_local;
  
  local_19 = checkSignature;
  pSStack_18 = sit;
  sit_local = (SerialIter *)this;
  type = getFormat();
  STObject::STObject(&this->super_STObject,type,pSStack_18,(SField *)sfValidation);
  CountedObject<jbcoin::STValidation>::CountedObject((CountedObject<jbcoin::STValidation> *)this);
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_0051b060;
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::base_uint(&this->mNodeID);
  this->mTrusted = false;
  std::chrono::
  time_point<jbcoin::NetClock,_std::chrono::duration<unsigned_int,_std::ratio<1L,_1L>_>_>::
  time_point(&this->mSeen);
  STObject::getFieldVL(&local_98,&this->super_STObject,(SField *)sfSigningPubKey);
  local_80 = makeSlice<unsigned_char,std::allocator<unsigned_char>>(&local_98);
  PublicKey::PublicKey(&local_70,&local_80);
  calcNodeID(&local_40,&local_70);
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::operator=(&this->mNodeID,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
  bVar1 = base_uint<160UL,_jbcoin::detail::NodeIDTag>::isNonZero(&this->mNodeID);
  if (!bVar1) {
    __assert_fail("mNodeID.isNonZero ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                  ,0x22,"jbcoin::STValidation::STValidation(SerialIter &, bool)");
  }
  if ((local_19 & 1) != 0) {
    bVar1 = isValid(this);
    if (!bVar1) {
      debugLog();
      beast::Journal::error((Journal *)&local_a8);
      bVar1 = beast::Journal::Stream::operator_cast_to_bool(&local_a8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        debugLog();
        beast::Journal::error((Journal *)(local_260 + 0x18));
        beast::Journal::Stream::operator<<
                  (&local_238,(Stream *)(local_260 + 0x18),(char (*) [19])"Invalid validation");
        STObject::getJson((STObject *)local_260,(int)this);
        beast::Journal::ScopedStream::operator<<(&local_238,(Value *)local_260);
        Json::Value::~Value((Value *)local_260);
        beast::Journal::ScopedStream::~ScopedStream(&local_238);
      }
      Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Invalid validation");
    }
  }
  return;
}

Assistant:

STValidation::STValidation (SerialIter& sit, bool checkSignature)
    : STObject (getFormat (), sit, sfValidation)
{
    mNodeID = calcNodeID(
        PublicKey(makeSlice (getFieldVL (sfSigningPubKey))));
    assert (mNodeID.isNonZero ());

    if  (checkSignature && !isValid ())
    {
        JLOG (debugLog().error())
            << "Invalid validation" << getJson (0);
        Throw<std::runtime_error> ("Invalid validation");
    }
}